

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usart_linux.c
# Opt level: O0

int csp_usart_open(csp_usart_conf_t *conf,csp_usart_callback_t rx_callback,void *user_data,
                  csp_usart_fd_t *return_fd)

{
  undefined8 uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  pthread_attr_t attributes;
  int ret;
  usart_context_t *ctx;
  termios options;
  int fd;
  int brate;
  pthread_attr_t local_b8;
  uint local_7c;
  long *local_78;
  termios local_6c;
  int local_30;
  speed_t local_2c;
  int *local_28;
  int local_4;
  
  if ((in_RSI == 0) && (in_RCX == (int *)0x0)) {
    csp_print_func("%s: No rx_callback function pointer or return_fd pointer provided\n",
                   "csp_usart_open");
    local_4 = -2;
  }
  else {
    local_2c = 0;
    iVar2 = *(int *)(in_RDI + 1);
    if (iVar2 == 0x12c0) {
      local_2c = 0xc;
    }
    else if (iVar2 == 0x2580) {
      local_2c = 0xd;
    }
    else if (iVar2 == 0x4b00) {
      local_2c = 0xe;
    }
    else if (iVar2 == 0x9600) {
      local_2c = 0xf;
    }
    else if (iVar2 == 0xe100) {
      local_2c = 0x1001;
    }
    else if (iVar2 == 0x1c200) {
      local_2c = 0x1002;
    }
    else if (iVar2 == 0x38400) {
      local_2c = 0x1003;
    }
    else if (iVar2 == 0x70800) {
      local_2c = 0x1004;
    }
    else if (iVar2 == 500000) {
      local_2c = 0x1005;
    }
    else if (iVar2 == 0x8ca00) {
      local_2c = 0x1006;
    }
    else if (iVar2 == 0xe1000) {
      local_2c = 0x1007;
    }
    else if (iVar2 == 1000000) {
      local_2c = 0x1008;
    }
    else if (iVar2 == 0x119400) {
      local_2c = 0x1009;
    }
    else if (iVar2 == 1500000) {
      local_2c = 0x100a;
    }
    else if (iVar2 == 2000000) {
      local_2c = 0x100b;
    }
    else if (iVar2 == 2500000) {
      local_2c = 0x100c;
    }
    else if (iVar2 == 3000000) {
      local_2c = 0x100d;
    }
    else if (iVar2 == 3500000) {
      local_2c = 0x100e;
    }
    else {
      if (iVar2 != 4000000) {
        csp_print_func("%s: Unsupported baudrate: %u\n","csp_usart_open",
                       (ulong)*(uint *)(in_RDI + 1));
        return -2;
      }
      local_2c = 0x100f;
    }
    local_28 = in_RCX;
    local_30 = open((char *)*in_RDI,0x902);
    if (local_30 < 0) {
      uVar1 = *in_RDI;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      csp_print_func("%s: failed to open device: [%s], errno: %s\n","csp_usart_open",uVar1,pcVar4);
      local_4 = -2;
    }
    else {
      tcgetattr(local_30,&local_6c);
      cfsetispeed(&local_6c,local_2c);
      cfsetospeed(&local_6c,local_2c);
      local_6c.c_cflag = local_6c.c_cflag & 0xfffffe8f | 0x8b0;
      local_6c.c_lflag = local_6c.c_lflag & 0xffff7fb4;
      local_6c.c_iflag = local_6c.c_iflag & 0xfffffa84;
      local_6c.c_oflag = local_6c.c_oflag & 0xffffff82;
      local_6c.c_cc[5] = '\0';
      local_6c.c_cc[6] = '\x01';
      iVar2 = tcsetattr(local_30,0,&local_6c);
      if (iVar2 == 0) {
        fcntl(local_30,4,0);
        iVar2 = tcflush(local_30,2);
        if (iVar2 == 0) {
          if (in_RSI != 0) {
            local_78 = (long *)calloc(1,0x20);
            if (local_78 == (long *)0x0) {
              uVar1 = *in_RDI;
              piVar3 = __errno_location();
              pcVar4 = strerror(*piVar3);
              csp_print_func("%s: Error allocating context, device: [%s], errno: %s\n",
                             "csp_usart_open",uVar1,pcVar4);
              close(local_30);
              return -1;
            }
            *local_78 = in_RSI;
            local_78[1] = in_RDX;
            *(int *)(local_78 + 2) = local_30;
            local_7c = pthread_attr_init(&local_b8);
            if (local_7c != 0) {
              free(local_78);
              close(local_30);
              return -1;
            }
            pthread_attr_setdetachstate(&local_b8,1);
            local_7c = pthread_create((pthread_t *)(local_78 + 3),&local_b8,usart_rx_thread,local_78
                                     );
            if (local_7c != 0) {
              uVar1 = *in_RDI;
              piVar3 = __errno_location();
              pcVar4 = strerror(*piVar3);
              csp_print_func("%s: pthread_create() failed to create Rx thread for device: [%s], errno: %s\n"
                             ,"csp_usart_open",uVar1,pcVar4);
              free(local_78);
              close(local_30);
              return -1;
            }
            local_7c = pthread_attr_destroy(&local_b8);
            if (local_7c != 0) {
              pcVar4 = strerror(local_7c);
              csp_print_func("%s: pthread_attr_destroy() failed: %s, errno: %d\n","csp_usart_open",
                             pcVar4,(ulong)local_7c);
            }
          }
          if (local_28 != (int *)0x0) {
            *local_28 = local_30;
          }
          local_4 = 0;
        }
        else {
          uVar1 = *in_RDI;
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          csp_print_func("%s: Error flushing device: [%s], errno: %s\n","csp_usart_open",uVar1,
                         pcVar4);
          close(local_30);
          local_4 = -0xb;
        }
      }
      else {
        uVar1 = *in_RDI;
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        csp_print_func("%s: Failed to set attributes on device: [%s], errno: %s\n","csp_usart_open",
                       uVar1,pcVar4);
        close(local_30);
        local_4 = -0xb;
      }
    }
  }
  return local_4;
}

Assistant:

int csp_usart_open(const csp_usart_conf_t * conf, csp_usart_callback_t rx_callback, void * user_data, csp_usart_fd_t * return_fd) {
	if (rx_callback == NULL && return_fd == NULL) {
		csp_print("%s: No rx_callback function pointer or return_fd pointer provided\n", __func__);
		return CSP_ERR_INVAL;
	}

	int brate = 0;
	switch (conf->baudrate) {
		case 4800:
			brate = B4800;
			break;
		case 9600:
			brate = B9600;
			break;
		case 19200:
			brate = B19200;
			break;
		case 38400:
			brate = B38400;
			break;
		case 57600:
			brate = B57600;
			break;
		case 115200:
			brate = B115200;
			break;
		case 230400:
			brate = B230400;
			break;
		case 460800:
			brate = B460800;
			break;
		case 500000:
			brate = B500000;
			break;
		case 576000:
			brate = B576000;
			break;
		case 921600:
			brate = B921600;
			break;
		case 1000000:
			brate = B1000000;
			break;
		case 1152000:
			brate = B1152000;
			break;
		case 1500000:
			brate = B1500000;
			break;
		case 2000000:
			brate = B2000000;
			break;
		case 2500000:
			brate = B2500000;
			break;
		case 3000000:
			brate = B3000000;
			break;
		case 3500000:
			brate = B3500000;
			break;
		case 4000000:
			brate = B4000000;
			break;
		default:
			csp_print("%s: Unsupported baudrate: %u\n", __func__, conf->baudrate);
			return CSP_ERR_INVAL;
	}

	int fd = open(conf->device, O_RDWR | O_NOCTTY | O_NONBLOCK);
	if (fd < 0) {
		csp_print("%s: failed to open device: [%s], errno: %s\n", __func__, conf->device, strerror(errno));
		return CSP_ERR_INVAL;
	}

	struct termios options;
	tcgetattr(fd, &options);
	cfsetispeed(&options, brate);
	cfsetospeed(&options, brate);
	options.c_cflag |= (CLOCAL | CREAD);
	options.c_cflag &= ~PARENB;
	options.c_cflag &= ~CSTOPB;
	options.c_cflag &= ~CSIZE;
	options.c_cflag |= CS8;
	options.c_lflag &= ~(ECHO | ECHONL | ICANON | IEXTEN | ISIG);
	options.c_iflag &= ~(IGNBRK | BRKINT | ICRNL | INLCR | PARMRK | INPCK | ISTRIP | IXON);
	options.c_oflag &= ~(OCRNL | ONLCR | ONLRET | ONOCR | OFILL | OPOST);
	options.c_cc[VTIME] = 0;
	options.c_cc[VMIN] = 1;
	/* tcsetattr() succeeds if just one attribute was changed, should read back attributes and check all has been changed */
	if (tcsetattr(fd, TCSANOW, &options) != 0) {
		csp_print("%s: Failed to set attributes on device: [%s], errno: %s\n", __func__, conf->device, strerror(errno));
		close(fd);
		return CSP_ERR_DRIVER;
	}
	fcntl(fd, F_SETFL, 0);

	/* Flush old transmissions */
	if (tcflush(fd, TCIOFLUSH) != 0) {
		csp_print("%s: Error flushing device: [%s], errno: %s\n", __func__, conf->device, strerror(errno));
		close(fd);
		return CSP_ERR_DRIVER;
	}

	if (rx_callback) {
		usart_context_t * ctx = calloc(1, sizeof(*ctx));
		if (ctx == NULL) {
			csp_print("%s: Error allocating context, device: [%s], errno: %s\n", __func__, conf->device, strerror(errno));
			close(fd);
			return CSP_ERR_NOMEM;
		}
		ctx->rx_callback = rx_callback;
		ctx->user_data = user_data;
		ctx->fd = fd;
		int ret;
		pthread_attr_t attributes;

		ret = pthread_attr_init(&attributes);
		if (ret != 0) {
			free(ctx);
			close(fd);
			return CSP_ERR_NOMEM;
		}
		pthread_attr_setdetachstate(&attributes, PTHREAD_CREATE_DETACHED);
		ret = pthread_create(&ctx->rx_thread, &attributes, usart_rx_thread, ctx);
		if (ret != 0) {
			csp_print("%s: pthread_create() failed to create Rx thread for device: [%s], errno: %s\n", __func__, conf->device, strerror(errno));
			free(ctx);
			close(fd);
			return CSP_ERR_NOMEM;
		}
		ret = pthread_attr_destroy(&attributes);
		if (ret != 0) {
			csp_print("%s: pthread_attr_destroy() failed: %s, errno: %d\n", __func__, strerror(ret), ret);
		}
	}

	if (return_fd) {
		*return_fd = fd;
	}

	return CSP_ERR_NONE;
}